

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

sockaddr_in6 *
sznet::net::sockets::sz_sock_getpeeraddr(sockaddr_in6 *__return_storage_ptr__,sz_sock sockfd)

{
  int iVar1;
  SourceFile file;
  Logger local_fe8;
  socklen_t local_14 [2];
  socklen_t addrlen;
  
  *(undefined8 *)((long)&(__return_storage_ptr__->sin6_addr).__in6_u + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->sin6_addr).__in6_u + 0xc) = 0;
  __return_storage_ptr__->sin6_family = 0;
  __return_storage_ptr__->sin6_port = 0;
  __return_storage_ptr__->sin6_flowinfo = 0;
  *(undefined8 *)&(__return_storage_ptr__->sin6_addr).__in6_u = 0;
  local_14[0] = 0x1c;
  iVar1 = getpeername(sockfd,(sockaddr *)__return_storage_ptr__,local_14);
  if (iVar1 < 0) {
    file._8_8_ = 0xe;
    file.m_data = "SocketsOps.cpp";
    Logger::Logger(&local_fe8,file,0x171,false);
    if (0x1c < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,"sockets::sz_sock_getpeeraddr",0x1c);
      local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x1c;
    }
    Logger::~Logger(&local_fe8);
  }
  return __return_storage_ptr__;
}

Assistant:

struct sockaddr_in6 sz_sock_getpeeraddr(sz_sock sockfd)
{
	struct sockaddr_in6 peeraddr;
	memset(&peeraddr, 0, sizeof(peeraddr));
	socklen_t addrlen = static_cast<socklen_t>(sizeof(peeraddr));
	if (::getpeername(sockfd, sz_sockaddr_cast(&peeraddr), &addrlen) < 0)
	{
		LOG_SYSERR << "sockets::sz_sock_getpeeraddr";
	}
	return peeraddr;
}